

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall
VariantMoveTest_move_assign_to_empty_Test::~VariantMoveTest_move_assign_to_empty_Test
          (VariantMoveTest_move_assign_to_empty_Test *this)

{
  VariantMoveTest_move_assign_to_empty_Test *this_local;
  
  ~VariantMoveTest_move_assign_to_empty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VariantMoveTest, move_assign_to_empty) {
    {
        Variant<A, B, C> v1{};
        Variant<A, B, C> v2{};
        v2.set(C());

        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(move_ctor_count, 1);
        EXPECT_EQ(dtor_count, 1);

        EXPECT_TRUE(v1.holds<empty>());
        EXPECT_FALSE(v2.holds<empty>());

        v2 = std::move(v1);
        // NOLINTNEXTLINE(bugprone-use-after-move,clang-analyzer-cplusplus.Move)
        EXPECT_TRUE(v1.holds<empty>());
        EXPECT_TRUE(v2.holds<empty>());
    }
    EXPECT_EQ(ctor_count, 1);
    EXPECT_EQ(move_ctor_count, 1);
    EXPECT_EQ(dtor_count, 2);
}